

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O3

Link * Link::factory(int type_,string *name_,MemPool *memPool)

{
  pointer pcVar1;
  Pump *this;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_80;
  string local_60;
  string local_40;
  
  if (type_ == 2) {
    this = (Pump *)MemPool::alloc(memPool,0xb8);
    paVar3 = &local_40.field_2;
    pcVar1 = (name_->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + name_->_M_string_length);
    Valve::Valve((Valve *)this,&local_40);
    _Var2._M_p = local_40._M_dataplus._M_p;
  }
  else if (type_ == 1) {
    this = (Pump *)MemPool::alloc(memPool,0x148);
    paVar3 = &local_60.field_2;
    pcVar1 = (name_->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + name_->_M_string_length);
    Pump::Pump(this,&local_60);
    _Var2._M_p = local_60._M_dataplus._M_p;
  }
  else {
    if (type_ != 0) {
      return (Link *)0x0;
    }
    this = (Pump *)MemPool::alloc(memPool,0xe8);
    paVar3 = &local_80.field_2;
    pcVar1 = (name_->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + name_->_M_string_length);
    Pipe::Pipe((Pipe *)this,&local_80);
    _Var2._M_p = local_80._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p);
  }
  return &this->super_Link;
}

Assistant:

Link* Link::factory(int type_, string name_, MemPool* memPool)
{
    switch (type_)
    {
    case PIPE:
        return new(memPool->alloc(sizeof(Pipe))) Pipe(name_);
        break;
    case PUMP:
        return new(memPool->alloc(sizeof(Pump))) Pump(name_);
        break;
    case VALVE:
        return new(memPool->alloc(sizeof(Valve))) Valve(name_);
        break;
    default:
        return nullptr;
    }
}